

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new_meshfile_operations.cpp
# Opt level: O0

int __thiscall MSH::mesh_file::scan_Elements(mesh_file *this,fstream *mesh_file,string *line_buffer)

{
  pointer Input;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  pair<const_int,_MSH::element> local_108;
  int local_c8;
  int local_c4;
  int local_c0;
  int j;
  int local_b8;
  int i;
  int first_end;
  int tag_count;
  int index;
  int counter;
  element input_ele;
  size_type element_size;
  is_any_ofF<char> local_58;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_str_vec;
  string *line_buffer_local;
  fstream *mesh_file_local;
  mesh_file *this_local;
  
  split_str_vec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = line_buffer;
  while( true ) {
    bVar1 = std::operator!=(split_str_vec.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,"$EndElements");
    if (!bVar1) {
      return 0;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)mesh_file,
               (string *)
               split_str_vec.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    boost::algorithm::erase_all<std::__cxx11::string,char[2]>
              (split_str_vec.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [2])0x1f6ef6);
    bVar1 = std::operator==(split_str_vec.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,"$EndElements");
    if (bVar1) break;
    iVar2 = check_read_state(mesh_file);
    if (iVar2 != 0) {
      return 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40);
    Input = split_str_vec.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    boost::algorithm::is_any_of<char[2]>(&local_58,(char (*) [2])0x1f998a);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40,Input,&local_58,token_compress_off);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_58);
    input_ele.node_vect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_40);
    if ((pointer)0x5 <
        input_ele.node_vect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      element::element((element *)&index);
      tag_count = 1;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_40,0);
      first_end = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
      sVar4 = (size_type)tag_count;
      tag_count = tag_count + 1;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_40,sVar4);
      index = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
      sVar4 = (size_type)tag_count;
      tag_count = tag_count + 1;
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_40,sVar4);
      i = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
      local_b8 = tag_count + i;
      for (j = tag_count; j < local_b8; j = j + 1) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,(long)tag_count);
        local_c0 = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&input_ele,&local_c0);
        tag_count = tag_count + 1;
      }
      for (local_c4 = tag_count;
          (pointer)(long)local_c4 <
          input_ele.node_vect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage; local_c4 = local_c4 + 1) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,(long)local_c4);
        local_c8 = std::__cxx11::stoi(pvVar3,(size_t *)0x0,10);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &input_ele.tags.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_c8);
      }
      std::pair<const_int,_MSH::element>::pair<int_&,_MSH::element_&,_true>
                (&local_108,&first_end,(element *)&index);
      std::
      map<int,_MSH::element,_std::less<int>,_std::allocator<std::pair<const_int,_MSH::element>_>_>::
      insert(&this->elements_map,&local_108);
      std::pair<const_int,_MSH::element>::~pair(&local_108);
      element::~element((element *)&index);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40);
  }
  return 0;
}

Assistant:

int MSH::mesh_file::scan_Elements(std::fstream &mesh_file, std::string &line_buffer)
{
    while (line_buffer!="$EndElements")
    {
        getline(mesh_file,line_buffer);
        boost::erase_all(line_buffer, "\r");
        if (line_buffer=="$EndElements")
            break;
        if (check_read_state(mesh_file))
            return EXIT_FAILURE;
        std::vector<std::string> split_str_vec;
        boost::split(split_str_vec, line_buffer, boost::is_any_of(" "));
        auto element_size = split_str_vec.size();
        if (element_size>5)
        {
            element input_ele;
            int counter = 0;
            int index = std::stoi(split_str_vec[counter++]);
            input_ele.type = std::stoi(split_str_vec[counter++]);
            int tag_count = std::stoi(split_str_vec[counter++]);
            auto first_end = counter+tag_count;
            for (auto i = counter; i < first_end; i++)
            {
                input_ele.tags.push_back(std::stoi(split_str_vec[counter]));
                counter++;
            }
            for (auto j = counter; j < element_size; j++)
            {
                input_ele.node_vect.push_back(std::stoi(split_str_vec[j]));
            }
            elements_map.insert({index, input_ele});
        }
    }
    return EXIT_SUCCESS;
}